

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O0

void __thiscall
amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::
operator()(PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
           *this,MultiFab *mf,int icomp,int ncomp,IntVect *nghost,Real time,int bccomp)

{
  bool bVar1;
  Geometry *geom;
  byte bVar2;
  int in_ECX;
  FabArrayBase *in_RSI;
  Geometry *in_RDI;
  long in_R8;
  Box *bx_1;
  FArrayBox *dest;
  MFIter mfi;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> bcrs;
  int i;
  Box gdomain;
  Box *domain;
  int off;
  uint bitval;
  uint typ;
  int dir;
  BoxArray *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  MFIter *in_stack_fffffffffffffdd0;
  uchar flags_;
  FabArrayBase *fabarray_;
  MFIter *in_stack_fffffffffffffdf0;
  undefined1 *puVar3;
  Box *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  Box *in_stack_fffffffffffffe28;
  Box *b;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffffe80;
  undefined1 local_149 [33];
  undefined4 local_128;
  undefined1 local_124 [52];
  long local_f0;
  int local_e8;
  FabArrayBase *local_e0;
  int local_cc;
  long local_c8;
  uint local_bc;
  undefined4 *local_b8;
  Geometry *local_b0;
  int local_a8;
  uint local_a4;
  uint local_a0;
  int local_9c;
  undefined1 *local_98;
  uint local_90;
  int local_8c;
  undefined1 *local_88;
  int local_7c;
  uint *local_78;
  int local_70;
  int local_6c;
  undefined1 *local_68;
  uint local_60;
  int local_5c;
  MFIter *local_58;
  int local_4c;
  uint *local_48;
  int local_3c;
  undefined1 *local_38;
  int local_2c;
  int local_28;
  int local_24;
  MFIter *local_20;
  int local_18;
  int local_14;
  MFIter *local_10;
  int local_4;
  
  local_f0 = in_R8;
  local_e8 = in_ECX;
  local_e0 = in_RSI;
  bVar1 = Geometry::isAllPeriodic
                    ((Geometry *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
  if (!bVar1) {
    geom = (Geometry *)Geometry::Domain(in_RDI);
    local_124._28_8_ = geom;
    FabArrayBase::boxArray(local_e0);
    local_128 = BoxArray::ixType(in_stack_fffffffffffffdb8);
    local_b8 = &local_128;
    local_124._0_4_ = (geom->super_CoordSys).c_sys;
    local_124._4_4_ = *(int *)&(geom->super_CoordSys).field_0x4;
    local_124._8_8_ = (geom->super_CoordSys).offset[0];
    local_124._16_8_ = (geom->super_CoordSys).offset[1];
    local_124._24_4_ = *(undefined4 *)((geom->super_CoordSys).offset + 2);
    puVar3 = local_124;
    for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
      local_78 = &local_90;
      local_7c = local_9c;
      local_4c = local_9c;
      local_28 = local_9c;
      bVar2 = (byte)local_9c;
      local_a0 = (uint)((local_128 & 1 << (bVar2 & 0x1f)) != 0);
      local_88 = local_124 + 0x18;
      local_8c = local_9c;
      local_3c = local_9c;
      local_2c = local_9c;
      local_a4 = (uint)((local_124._24_4_ & 1 << (bVar2 & 0x1f)) != 0);
      local_a8 = local_a0 - local_a4;
      local_68 = local_124 + 0xc;
      local_6c = local_9c;
      *(int *)(local_68 + (long)local_9c * 4) = local_a8 + *(int *)(local_68 + (long)local_9c * 4);
      in_stack_fffffffffffffdf0 = (MFIter *)(local_124 + 0x18);
      local_5c = local_9c;
      if (local_a0 == 0) {
        local_24 = local_9c;
        local_18 = local_9c;
        local_124._24_4_ = (1 << (bVar2 & 0x1f) ^ 0xffffffffU) & local_124._24_4_;
        local_20 = in_stack_fffffffffffffdf0;
      }
      else {
        local_14 = local_9c;
        local_4 = local_9c;
        local_124._24_4_ = 1 << (bVar2 & 0x1f) | local_124._24_4_;
        local_10 = in_stack_fffffffffffffdf0;
      }
      local_70 = local_a8;
      local_60 = local_a0;
      local_58 = in_stack_fffffffffffffdf0;
      local_48 = local_78;
      local_38 = local_88;
    }
    local_bc = local_128;
    local_b0 = geom;
    local_98 = puVar3;
    local_90 = local_128;
    for (local_149._29_4_ = 0; (int)local_149._29_4_ < 3; local_149._29_4_ = local_149._29_4_ + 1) {
      bVar1 = Geometry::isPeriodic(in_RDI,local_149._29_4_);
      if (bVar1) {
        local_c8 = local_f0;
        local_cc = local_149._29_4_;
        Box::grow((Box *)local_124,local_149._29_4_,
                  *(int *)(local_f0 + (long)(int)local_149._29_4_ * 4));
      }
    }
    flags_ = (uchar)(local_e8 >> 0x1f);
    fabarray_ = (FabArrayBase *)local_149;
    std::allocator<amrex::BCRec>::allocator((allocator<amrex::BCRec> *)0xe46399);
    Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
              ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
               CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               (size_type)in_stack_fffffffffffffdb8,(allocator_type *)0xe463b0);
    std::allocator<amrex::BCRec>::~allocator((allocator<amrex::BCRec> *)0xe463bf);
    MFIter::MFIter(in_stack_fffffffffffffdf0,fabarray_,flags_);
    while (bVar1 = MFIter::isValid((MFIter *)&stack0xfffffffffffffe40), bVar1) {
      FabArray<amrex::FArrayBox>::operator[]
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                 (MFIter *)in_stack_fffffffffffffdb8);
      MFIter::fabbox(in_stack_fffffffffffffdd0);
      b = (Box *)&stack0xfffffffffffffe14;
      bVar1 = Box::contains((Box *)local_124,b);
      if (!bVar1) {
        in_stack_fffffffffffffdb8 = (BoxArray *)(local_149 + 1);
        setBC(b,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,in_stack_fffffffffffffe20,
              in_stack_fffffffffffffe1c,
              (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffffe10,
              in_stack_fffffffffffffe80);
        in_stack_fffffffffffffdc0 = 0;
        GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::operator()
                  ((GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> *)
                   CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   in_stack_fffffffffffffe10,(FArrayBox *)in_RDI,(int)((ulong)puVar3 >> 0x20),
                   (int)puVar3,geom,(Real)in_stack_fffffffffffffdf0,
                   (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                   in_stack_fffffffffffffe40._M_head_impl,in_stack_fffffffffffffe48,
                   in_stack_fffffffffffffe50);
      }
      MFIter::operator++((MFIter *)&stack0xfffffffffffffe40);
    }
    MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
              ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0xe46570);
  }
  return;
}

Assistant:

void operator() (MultiFab& mf, int icomp, int ncomp, IntVect const& nghost,
                     Real time, int bccomp)
    {
        if (m_geom.isAllPeriodic()) return;

        BL_PROFILE("PhysBCFunct::()");

        //! create a grown domain box containing valid + periodic cells
        const Box& domain = m_geom.Domain();
        Box gdomain = amrex::convert(domain, mf.boxArray().ixType());
        for (int i = 0; i < AMREX_SPACEDIM; ++i) {
            if (m_geom.isPeriodic(i)) {
                gdomain.grow(i, nghost[i]);
            }
        }

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        {
            Vector<BCRec> bcrs(ncomp);
            for (MFIter mfi(mf); mfi.isValid(); ++mfi)
            {
                FArrayBox& dest = mf[mfi];
                const Box& bx = mfi.fabbox();

                //! if there are cells not in the valid + periodic grown box
                //! we need to fill them here
                //!
                if (!gdomain.contains(bx))
                {
                    //! Based on BCRec for the domain, we need to make BCRec for this Box
                    amrex::setBC(bx, domain, bccomp, 0, ncomp, m_bcr, bcrs);

                    //! Note that we pass 0 as starting component of bcrs.
                    m_f(bx, dest, icomp, ncomp, m_geom, time, bcrs, 0, bccomp);
                }
            }
        }
    }